

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::traverseNodeDependencies
          (Node *this,Reader *schemaNode,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  uint uVar1;
  undefined4 uVar2;
  ListElementCount LVar3;
  uint64_t uVar4;
  Reader field;
  Reader superclass;
  Reader interface;
  IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
  local_110;
  Node *local_100;
  Reader local_f8;
  Reader local_c8;
  Reader local_98;
  undefined1 local_68 [56];
  
  if ((schemaNode->_reader).dataSize < 0x70) goto switchD_00116179_default;
  switch(*(undefined2 *)((long)(schemaNode->_reader).data + 0xc)) {
  case 1:
    local_f8._reader.segment = (schemaNode->_reader).segment;
    local_f8._reader.capTable = (schemaNode->_reader).capTable;
    local_f8._reader.data = (schemaNode->_reader).data;
    local_f8._reader.pointers = (schemaNode->_reader).pointers;
    local_f8._reader.dataSize = (schemaNode->_reader).dataSize;
    local_f8._reader.pointerCount = (schemaNode->_reader).pointerCount;
    local_f8._reader._38_2_ = *(undefined2 *)&(schemaNode->_reader).field_0x26;
    local_f8._reader.nestingLimit = (schemaNode->_reader).nestingLimit;
    local_f8._reader._44_4_ = *(undefined4 *)&(schemaNode->_reader).field_0x2c;
    capnp::schema::Node::Struct::Reader::getFields((Reader *)local_68,&local_f8);
    uVar2 = local_68._24_4_;
    local_110.container = (Reader *)local_68;
    for (local_110.index = 0; local_110.index != uVar2; local_110.index = local_110.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
      ::operator*((Reader *)&local_f8,&local_110);
      if ((local_f8._reader.dataSize < 0x50) || (*(short *)((long)local_f8._reader.data + 8) == 0))
      {
        local_98._reader.dataSize = local_f8._reader.dataSize;
        local_98._reader.pointerCount = local_f8._reader.pointerCount;
        local_98._reader._38_2_ = local_f8._reader._38_2_;
        local_98._reader.nestingLimit = local_f8._reader.nestingLimit;
        local_98._reader._44_4_ = local_f8._reader._44_4_;
        local_98._reader.data = local_f8._reader.data;
        local_98._reader.pointers = local_f8._reader.pointers;
        local_98._reader.segment = local_f8._reader.segment;
        local_98._reader.capTable = local_f8._reader.capTable;
        capnp::schema::Field::Slot::Reader::getType(&local_c8,&local_98);
        traverseType(this,&local_c8,eagerness,seen,finalLoader,sourceInfo);
      }
      capnp::schema::Field::Reader::getAnnotations((Reader *)&local_c8,(Reader *)&local_f8);
      traverseAnnotations(this,(Reader *)&local_c8,eagerness,seen,finalLoader,sourceInfo);
    }
    break;
  case 2:
    local_f8._reader.segment = (schemaNode->_reader).segment;
    local_f8._reader.capTable = (schemaNode->_reader).capTable;
    local_f8._reader.data = (schemaNode->_reader).data;
    local_f8._reader.pointers = (schemaNode->_reader).pointers;
    local_f8._reader.dataSize = (schemaNode->_reader).dataSize;
    local_f8._reader.pointerCount = (schemaNode->_reader).pointerCount;
    local_f8._reader._38_2_ = *(undefined2 *)&(schemaNode->_reader).field_0x26;
    local_f8._reader.nestingLimit = (schemaNode->_reader).nestingLimit;
    local_f8._reader._44_4_ = *(undefined4 *)&(schemaNode->_reader).field_0x2c;
    capnp::schema::Node::Enum::Reader::getEnumerants((Reader *)local_68,(Reader *)&local_f8);
    local_98._reader.capTable =
         (CapTableReader *)((ulong)local_98._reader.capTable & 0xffffffff00000000);
    LVar3 = 0;
    uVar2 = local_68._24_4_;
    local_98._reader.segment = (SegmentReader *)local_68;
    while (LVar3 != uVar2) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
      ::operator*((Reader *)&local_f8,
                  (IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                   *)&local_98);
      capnp::schema::Enumerant::Reader::getAnnotations((Reader *)&local_c8,(Reader *)&local_f8);
      traverseAnnotations(this,(Reader *)&local_c8,eagerness,seen,finalLoader,sourceInfo);
      LVar3 = (uint)local_98._reader.capTable + 1;
      local_98._reader.capTable = (CapTableReader *)CONCAT44(local_98._reader.capTable._4_4_,LVar3);
    }
    break;
  case 3:
    local_68._0_8_ = (schemaNode->_reader).segment;
    local_68._8_8_ = (schemaNode->_reader).capTable;
    local_68._16_8_ = (schemaNode->_reader).data;
    local_68._24_8_ = (schemaNode->_reader).pointers;
    local_68._32_8_ = *(undefined8 *)&(schemaNode->_reader).dataSize;
    local_68._40_4_ = (schemaNode->_reader).nestingLimit;
    local_68._44_4_ = *(undefined4 *)&(schemaNode->_reader).field_0x2c;
    capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&local_f8,(Reader *)local_68);
    uVar1 = (uint)local_f8._reader.pointers;
    local_110.container = (Reader *)&local_f8;
    for (local_110.index = 0; local_110.index != uVar1; local_110.index = local_110.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
      ::operator*((Reader *)&local_c8,
                  (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                   *)&local_110);
      if ((0x3f < local_c8._reader.dataSize) && (*local_c8._reader.data != 0)) {
        traverseDependency(this,*local_c8._reader.data,eagerness,seen,finalLoader,sourceInfo,false);
      }
      capnp::schema::Superclass::Reader::getBrand((Reader *)&local_98,(Reader *)&local_c8);
      traverseBrand(this,(Reader *)&local_98,eagerness,seen,finalLoader,sourceInfo);
    }
    capnp::schema::Node::Interface::Reader::getMethods((Reader *)&local_f8,(Reader *)local_68);
    uVar1 = (uint)local_f8._reader.pointers;
    local_110.container = (Reader *)&local_f8;
    local_100 = this;
    for (local_110.index = 0; local_110.index != uVar1; local_110.index = local_110.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
      ::operator*((Reader *)&local_c8,
                  (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                   *)&local_110);
      if (local_c8._reader.dataSize < 0x80) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(uint64_t *)((long)local_c8._reader.data + 8);
      }
      traverseDependency(this,uVar4,eagerness,seen,finalLoader,sourceInfo,true);
      capnp::schema::Method::Reader::getParamBrand((Reader *)&local_98,(Reader *)&local_c8);
      traverseBrand(this,(Reader *)&local_98,eagerness,seen,finalLoader,sourceInfo);
      if (local_c8._reader.dataSize < 0xc0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(uint64_t *)((long)local_c8._reader.data + 0x10);
      }
      traverseDependency(this,uVar4,eagerness,seen,finalLoader,sourceInfo,true);
      capnp::schema::Method::Reader::getResultBrand((Reader *)&local_98,(Reader *)&local_c8);
      traverseBrand(local_100,(Reader *)&local_98,eagerness,seen,finalLoader,sourceInfo);
      this = local_100;
      capnp::schema::Method::Reader::getAnnotations((Reader *)&local_98,(Reader *)&local_c8);
      traverseAnnotations(this,(Reader *)&local_98,eagerness,seen,finalLoader,sourceInfo);
    }
    break;
  case 4:
    local_f8._reader.segment = (schemaNode->_reader).segment;
    local_f8._reader.capTable = (schemaNode->_reader).capTable;
    local_f8._reader.data = (schemaNode->_reader).data;
    local_f8._reader.pointers = (schemaNode->_reader).pointers;
    local_f8._reader.dataSize = (schemaNode->_reader).dataSize;
    local_f8._reader.pointerCount = (schemaNode->_reader).pointerCount;
    local_f8._reader._38_2_ = *(undefined2 *)&(schemaNode->_reader).field_0x26;
    local_f8._reader.nestingLimit = (schemaNode->_reader).nestingLimit;
    local_f8._reader._44_4_ = *(undefined4 *)&(schemaNode->_reader).field_0x2c;
    capnp::schema::Node::Const::Reader::getType((Reader *)local_68,(Reader *)&local_f8);
    goto LAB_001164f2;
  case 5:
    local_f8._reader.segment = (schemaNode->_reader).segment;
    local_f8._reader.capTable = (schemaNode->_reader).capTable;
    local_f8._reader.data = (schemaNode->_reader).data;
    local_f8._reader.pointers = (schemaNode->_reader).pointers;
    local_f8._reader.dataSize = (schemaNode->_reader).dataSize;
    local_f8._reader.pointerCount = (schemaNode->_reader).pointerCount;
    local_f8._reader._38_2_ = *(undefined2 *)&(schemaNode->_reader).field_0x26;
    local_f8._reader.nestingLimit = (schemaNode->_reader).nestingLimit;
    local_f8._reader._44_4_ = *(undefined4 *)&(schemaNode->_reader).field_0x2c;
    capnp::schema::Node::Annotation::Reader::getType((Reader *)local_68,(Reader *)&local_f8);
LAB_001164f2:
    traverseType(this,(Reader *)local_68,eagerness,seen,finalLoader,sourceInfo);
  }
switchD_00116179_default:
  capnp::schema::Node::Reader::getAnnotations((Reader *)local_68,schemaNode);
  traverseAnnotations(this,(Reader *)local_68,eagerness,seen,finalLoader,sourceInfo);
  return;
}

Assistant:

void Compiler::Node::traverseNodeDependencies(
    const schema::Node::Reader& schemaNode, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  switch (schemaNode.which()) {
    case schema::Node::STRUCT:
      for (auto field: schemaNode.getStruct().getFields()) {
        switch (field.which()) {
          case schema::Field::SLOT:
            traverseType(field.getSlot().getType(), eagerness, seen, finalLoader, sourceInfo);
            break;
          case schema::Field::GROUP:
            // Aux node will be scanned later.
            break;
        }

        traverseAnnotations(field.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::ENUM:
      for (auto enumerant: schemaNode.getEnum().getEnumerants()) {
        traverseAnnotations(enumerant.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::INTERFACE: {
      auto interface = schemaNode.getInterface();
      for (auto superclass: interface.getSuperclasses()) {
        uint64_t superclassId = superclass.getId();
        if (superclassId != 0) {  // if zero, we reported an error earlier
          traverseDependency(superclassId, eagerness, seen, finalLoader, sourceInfo);
        }
        traverseBrand(superclass.getBrand(), eagerness, seen, finalLoader, sourceInfo);
      }
      for (auto method: interface.getMethods()) {
        traverseDependency(
            method.getParamStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getParamBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseDependency(
            method.getResultStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getResultBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseAnnotations(method.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;
    }

    case schema::Node::CONST:
      traverseType(schemaNode.getConst().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    case schema::Node::ANNOTATION:
      traverseType(schemaNode.getAnnotation().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    default:
      break;
  }

  traverseAnnotations(schemaNode.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
}